

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O1

bool pd::prepareDataPhrasesFromWordvec
               (string *dir_name,string *data_filename,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
               *words_dict)

{
  uint uVar1;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  error_code *peVar5;
  ostream *poVar6;
  istream *piVar7;
  const_iterator cVar8;
  double *pdVar9;
  basic_ostream<char,_std::char_traits<char>_> *pbVar10;
  undefined8 uVar11;
  bool bVar12;
  long local_518;
  ofstream of;
  ios_base local_420 [264];
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_318;
  ifstream fi;
  dir_itr_imp local_308 [16];
  uint auStack_2f8 [122];
  size_type *local_110;
  path targetDir;
  long local_e8;
  undefined1 local_e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_b0;
  undefined1 local_a8 [8];
  string line;
  vector<double,_std::allocator<double>_> result;
  directory_iterator local_60;
  directory_iterator it;
  directory_iterator eod;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_48;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_40;
  directory_iterator local_38;
  
  local_110 = &targetDir.m_pathname._M_string_length;
  pcVar2 = (dir_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar2,pcVar2 + dir_name->_M_string_length);
  boost::filesystem::directory_iterator::directory_iterator(&local_60,(path *)&local_110,none);
  it.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  std::ofstream::ofstream(&local_518,(string *)data_filename,_S_out);
  local_318 = local_60.m_imp.px;
  if (local_60.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_60.m_imp.px = *(int *)local_60.m_imp.px + 1;
    UNLOCK();
  }
  _fi = it.m_imp.px;
  if (it.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)it.m_imp.px = *(int *)it.m_imp.px + 1;
    UNLOCK();
  }
  eod.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
                 (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_60;
  if (local_60.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_60.m_imp.px = *(int *)local_60.m_imp.px + 1;
    UNLOCK();
  }
  local_48 = it.m_imp.px;
  if (it.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)it.m_imp.px = *(int *)it.m_imp.px + 1;
    UNLOCK();
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&fi);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_318);
  local_318 = eod.m_imp.px;
  if (eod.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)eod.m_imp.px = *(int *)eod.m_imp.px + 1;
    UNLOCK();
  }
  local_38 = (directory_iterator)(directory_iterator)eod.m_imp.px;
  if (eod.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)eod.m_imp.px = *(int *)eod.m_imp.px + 1;
    UNLOCK();
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_318);
  local_318.px = local_48.px;
  if (local_48.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_48.px = *(int *)local_48.px + 1;
    UNLOCK();
  }
  local_40.px = local_48.px;
  if (local_48.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_48.px = *(int *)local_48.px + 1;
    UNLOCK();
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_318);
  local_b0 = &words_dict->_M_h;
  do {
    if ((local_38.m_imp.px == (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_40.px) ||
       (((local_38.m_imp.px == (dir_itr_imp *)0x0 ||
         (*(long *)((long)local_38.m_imp.px + 0x38) == 0)) &&
        ((local_40.px == (dir_itr_imp *)0x0 || (*(long *)(local_40.px + 0x38) == 0)))))) {
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_38.m_imp);
      bVar12 = true;
LAB_0010e210:
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_48);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&eod.m_imp);
      local_518 = _VTT;
      *(undefined8 *)((long)&local_518 + *(long *)(_VTT + -0x18)) = _sentry;
      std::filebuf::~filebuf((filebuf *)&of);
      std::ios_base::~ios_base(local_420);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&it.m_imp);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_60.m_imp);
      if (local_110 != &targetDir.m_pathname._M_string_length) {
        operator_delete(local_110);
      }
      return bVar12;
    }
    peVar5 = (error_code *)boost::filesystem::directory_iterator::dereference(&local_38);
    boost::filesystem::detail::status((path *)&local_318,peVar5);
    if ((int)local_318.px == 2) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)peVar5,(long)peVar5->cat_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      boost::filesystem::path::extension();
      iVar4 = boost::filesystem::path::compare((path *)&local_318,"swp");
      if (local_318.px != local_308) {
        operator_delete(local_318.px);
      }
      if (iVar4 != 0) {
        std::ifstream::ifstream((istream *)&local_318,(string *)peVar5,_S_in);
        uVar1 = *(uint *)((long)auStack_2f8 + *(long *)(local_318.px + -0x18));
        if ((uVar1 & 5) == 0) {
          local_a8 = (undefined1  [8])&line._M_string_length;
          line._M_dataplus._M_p = (pointer)0x0;
          line._M_string_length._0_1_ = 0;
          line.field_2._8_8_ = 0;
          while( true ) {
            cVar3 = std::ios::widen((char)*(undefined8 *)(local_318.px + -0x18) +
                                    (char)(istream *)&local_318);
            piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)&local_318,(string *)local_a8,cVar3);
            uVar11 = line.field_2._8_8_;
            if ((((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) ||
               (line._M_dataplus._M_p == (pointer)0x0)) break;
            cVar8 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&words_dict->_M_h,(key_type *)local_a8);
            if (cVar8.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"word ",5);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(char *)local_a8,(long)line._M_dataplus._M_p
                                 );
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," in file ",9);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar6,*(char **)peVar5,(long)peVar5->cat_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar6," isn\'t found in dictionary",0x1a);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
              std::ostream::put((char)poVar6);
              std::ostream::flush();
            }
            else if (line.field_2._8_8_ == 0) {
              std::vector<double,_std::allocator<double>_>::operator=
                        ((vector<double,_std::allocator<double>_> *)((long)&line.field_2 + 8),
                         (vector<double,_std::allocator<double>_> *)
                         ((long)cVar8.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_true>
                                ._M_cur + 0x28));
            }
            else {
              pdVar9 = (((vector<double,_std::allocator<double>_> *)
                        ((long)cVar8.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_true>
                               ._M_cur + 0x28))->super__Vector_base<double,_std::allocator<double>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar11 = line.field_2._8_8_;
              do {
                *(double *)uVar11 = *(double *)uVar11 + *pdVar9;
                uVar11 = uVar11 + 8;
                pdVar9 = pdVar9 + 1;
              } while ((double *)uVar11 != (double *)0x0);
            }
          }
          for (; (double *)uVar11 != (double *)0x0; uVar11 = (double *)(uVar11 + 8)) {
            poVar6 = std::ostream::_M_insert<double>(*(double *)uVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
          }
          boost::filesystem::path::filename();
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,targetDir.m_pathname.field_2._8_8_,
                     local_e8 + targetDir.m_pathname.field_2._8_8_);
          words_dict = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                        *)local_b0;
          pbVar10 = boost::io::detail::
                    quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                              ((basic_ostream<char,_std::char_traits<char>_> *)&local_518,&local_d0,
                               '&','\"');
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)pbVar10 + -0x18) + (char)pbVar10);
          std::ostream::put((char)pbVar10);
          std::ostream::flush();
          if ((undefined1 *)targetDir.m_pathname.field_2._8_8_ != local_e0) {
            operator_delete((void *)targetDir.m_pathname.field_2._8_8_);
          }
          if (line.field_2._8_8_ != 0) {
            operator_delete((void *)line.field_2._8_8_);
          }
          if (local_a8 != (undefined1  [8])&line._M_string_length) {
            operator_delete((void *)local_a8);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,*(char **)peVar5,(long)peVar5->cat_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"doesn\'t exist",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
        std::ifstream::~ifstream((istream *)&local_318);
        if ((uVar1 & 5) != 0) {
          boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40);
          boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                    (&local_38.m_imp);
          bVar12 = false;
          goto LAB_0010e210;
        }
      }
    }
    boost::filesystem::detail::directory_iterator_increment(&local_38,(error_code *)0x0);
  } while( true );
}

Assistant:

bool prepareDataPhrasesFromWordvec(const std::string& dir_name, const std::string& data_filename, const std::unordered_map<std::string, std::vector<double>>& words_dict)
    {        
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        std::ofstream of(data_filename);
        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                std::cout << p.string() << std::endl;
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                std::vector<double> result;
                while (std::getline(fi, line) and !line.empty())
                {
                    const std::unordered_map<std::string, std::vector<double>>::const_iterator it = words_dict.find(line);
                    if (it == words_dict.end())
                    {
                        std::cerr << "word " << line << " in file " << p.string() << " isn't found in dictionary" << std::endl;
                        //return false;
                        continue;
                    }
                    
                    if (result.size() == 0)
                        result = it->second;
                    else
                        std::transform (result.begin(), result.end(), it->second.begin(), result.begin(), std::plus<double>());                            
                }
                
                for (const double elem: result)
                    of << elem << ",";
                of << p.filename() << std::endl;
            } 
        }
        return true;
    }